

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractDOMParser::notationDecl
          (AbstractDOMParser *this,XMLNotationDecl *notDecl,bool param_2)

{
  XMLBuffer *pXVar1;
  XMLSize_t XVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  XMLCh *chars;
  XMLCh *chars_00;
  undefined7 in_register_00000011;
  long *plVar5;
  
  iVar4 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3c])
                    (this->fDocument,notDecl->fName,CONCAT71(in_register_00000011,param_2));
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  (**(code **)(*plVar5 + 0x160))(plVar5,notDecl->fPublicId);
  (**(code **)(*plVar5 + 0x168))(plVar5,notDecl->fSystemId);
  (**(code **)(*plVar5 + 0x170))(plVar5,notDecl->fBaseURI);
  iVar4 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x2a])();
  plVar6 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x10))
                             ((long *)CONCAT44(extraout_var_00,iVar4),plVar5);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x138))(plVar6);
  }
  bVar3 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar3) {
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'<';
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'!';
    XMLBuffer::append(this->fInternalSubset,L"NOTATION");
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L' ';
    XMLBuffer::append(this->fInternalSubset,notDecl->fName);
    chars = (XMLCh *)(**(code **)(*plVar5 + 0x140))(plVar5);
    if (chars != (XMLCh *)0x0) {
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgPubIDString);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
      XMLBuffer::append(this->fInternalSubset,chars);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
    }
    chars_00 = (XMLCh *)(**(code **)(*plVar5 + 0x148))(plVar5);
    if (chars_00 != (XMLCh *)0x0) {
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L' ';
      if (chars == (XMLCh *)0x0) {
        XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgSysIDString);
        pXVar1 = this->fInternalSubset;
        if (pXVar1->fIndex == pXVar1->fCapacity) {
          XMLBuffer::ensureCapacity(pXVar1,1);
        }
        XVar2 = pXVar1->fIndex;
        pXVar1->fIndex = XVar2 + 1;
        pXVar1->fBuffer[XVar2] = L' ';
      }
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
      XMLBuffer::append(this->fInternalSubset,chars_00);
      pXVar1 = this->fInternalSubset;
      if (pXVar1->fIndex == pXVar1->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar1,1);
      }
      XVar2 = pXVar1->fIndex;
      pXVar1->fIndex = XVar2 + 1;
      pXVar1->fBuffer[XVar2] = L'\"';
    }
    pXVar1 = this->fInternalSubset;
    if (pXVar1->fIndex == pXVar1->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar1,1);
    }
    XVar2 = pXVar1->fIndex;
    pXVar1->fIndex = XVar2 + 1;
    pXVar1->fBuffer[XVar2] = L'>';
  }
  return;
}

Assistant:

void AbstractDOMParser::notationDecl
(
    const   XMLNotationDecl&    notDecl
    , const bool
)
{
    DOMNotationImpl* notation = (DOMNotationImpl *)fDocument->createNotation(notDecl.getName());
    notation->setPublicId(notDecl.getPublicId());
    notation->setSystemId(notDecl.getSystemId());
    notation->setBaseURI(notDecl.getBaseURI());

    DOMNode* rem = fDocumentType->getNotations()->setNamedItem( notation );
    if (rem)
        rem->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgNotationString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(notDecl.getName());

        bool publicKeywordPrinted = false;

        const XMLCh* id = notation->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

            publicKeywordPrinted = true;
        }
        id = notation->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);

            if ( !publicKeywordPrinted ){
				fInternalSubset.append(XMLUni::fgSysIDString);
				fInternalSubset.append(chSpace);
			}

            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        fInternalSubset.append(chCloseAngle);
    }
}